

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMDocumentImpl::setDocumentURI(DOMDocumentImpl *this,XMLCh *documentURI)

{
  int iVar1;
  XMLSize_t XVar2;
  undefined4 extraout_var;
  XMLCh *temp;
  XMLCh *documentURI_local;
  DOMDocumentImpl *this_local;
  
  if ((documentURI == (XMLCh *)0x0) || (*documentURI == L'\0')) {
    this->fDocumentURI = (XMLCh *)0x0;
  }
  else {
    XVar2 = XMLString::stringLen(documentURI);
    iVar1 = (*(this->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(this,(XVar2 + 9) * 2);
    XMLString::fixURI(documentURI,(XMLCh *)CONCAT44(extraout_var,iVar1));
    this->fDocumentURI = (XMLCh *)CONCAT44(extraout_var,iVar1);
  }
  return;
}

Assistant:

void DOMDocumentImpl::setDocumentURI(const XMLCh* documentURI){
    if (documentURI && *documentURI) {
        XMLCh* temp = (XMLCh*) this->allocate((XMLString::stringLen(documentURI) + 9)*sizeof(XMLCh));
        XMLString::fixURI(documentURI, temp);
        fDocumentURI = temp;
    }
    else
        fDocumentURI = 0;
}